

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

macro_call_t new_macro_call(macro_t m,pos_t pos)

{
  macro_call_t pmVar1;
  
  pmVar1 = (macro_call_t)malloc(0x30);
  pmVar1->macro = m;
  (pmVar1->pos).fname = pos.fname;
  (pmVar1->pos).lno = (int)pos._8_8_;
  (pmVar1->pos).ln_pos = (int)((ulong)pos._8_8_ >> 0x20);
  pmVar1->repl_pos = 0;
  pmVar1->args = (VARR_token_arr_t *)0x0;
  VARR_token_tcreate(&pmVar1->repl_buffer,0x40);
  return pmVar1;
}

Assistant:

static macro_call_t new_macro_call (macro_t m, pos_t pos) {
  macro_call_t mc = malloc (sizeof (struct macro_call));

  mc->macro = m;
  mc->pos = pos;
  mc->repl_pos = 0;
  mc->args = NULL;
  VARR_CREATE (token_t, mc->repl_buffer, 64);
  return mc;
}